

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_inv_txfm_sse4.c
# Opt level: O3

void idct16x16_low8_sse4_1(__m128i *in,__m128i *out,int bit,int do_cols,int bd,int out_shift)

{
  undefined4 uVar1;
  int iVar2;
  byte bVar3;
  int iVar4;
  long lVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar12;
  int iVar13;
  undefined1 auVar11 [16];
  int iVar14;
  int iVar16;
  int iVar17;
  undefined1 auVar15 [16];
  int iVar18;
  int iVar19;
  int iVar21;
  int iVar22;
  int iVar23;
  int iVar24;
  undefined1 auVar20 [16];
  int iVar25;
  int iVar26;
  int iVar27;
  int iVar28;
  int iVar29;
  int iVar30;
  int iVar31;
  int iVar32;
  int iVar34;
  int iVar35;
  int iVar36;
  undefined1 auVar33 [16];
  int iVar37;
  int iVar38;
  int iVar39;
  int iVar40;
  int iVar41;
  int iVar42;
  int iVar43;
  int iVar44;
  int iVar45;
  int iVar46;
  uint uVar47;
  int iVar50;
  uint uVar51;
  int iVar52;
  uint uVar53;
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  int iVar54;
  uint uVar55;
  undefined1 auVar56 [16];
  int iVar57;
  int iVar61;
  int iVar62;
  undefined1 auVar58 [16];
  int iVar63;
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  int iVar64;
  int iVar73;
  int iVar75;
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  uint uVar65;
  uint uVar74;
  uint uVar76;
  int iVar77;
  uint uVar78;
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  int iVar79;
  uint uVar80;
  int iVar84;
  uint uVar85;
  int iVar86;
  uint uVar87;
  undefined1 auVar81 [16];
  int iVar88;
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  uint uVar89;
  int iVar90;
  int iVar95;
  int iVar96;
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  int iVar97;
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  int iVar98;
  int iVar99;
  int iVar102;
  int iVar103;
  int iVar104;
  int iVar105;
  undefined1 auVar100 [16];
  int iVar106;
  undefined1 auVar101 [16];
  int iVar107;
  int iVar108;
  int iVar109;
  int iVar110;
  int iVar111;
  int iVar112;
  int iVar115;
  int iVar116;
  undefined1 auVar113 [16];
  int iVar117;
  undefined1 auVar114 [16];
  __m128i clamp_hi_out;
  __m128i clamp_lo_out;
  int local_58;
  int iStack_54;
  int iStack_50;
  int iStack_4c;
  int local_48;
  int iStack_44;
  int iStack_40;
  int iStack_3c;
  
  auVar20 = ZEXT416((uint)bit);
  lVar5 = (long)bit * 0x100;
  iVar9 = -*(int *)((long)vert_filter_length_chroma + lVar5 + 0x200);
  iVar46 = *(int *)((long)vert_filter_length_chroma + lVar5 + 0x1a0);
  iVar10 = *(int *)((long)vert_filter_length_chroma + lVar5 + 0x220);
  iVar7 = -iVar46;
  iVar6 = -iVar10;
  iVar12 = -*(int *)((long)vert_filter_length_chroma + lVar5 + 0x1f0);
  iVar8 = 1 << ((char)bit - 1U & 0x1f);
  iVar13 = -*(int *)((long)vert_filter_length_chroma + lVar5 + 0x230);
  iVar2 = bd + 6 + (uint)(do_cols == 0) * 2;
  iVar4 = 0x8000;
  if (0xf < iVar2) {
    iVar4 = 1 << ((char)iVar2 - 1U & 0x1f);
  }
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar5 + 0x250);
  auVar66._4_4_ = uVar1;
  auVar66._0_4_ = uVar1;
  auVar66._8_4_ = uVar1;
  auVar66._12_4_ = uVar1;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar5 + 0x1d0);
  auVar91._4_4_ = uVar1;
  auVar91._0_4_ = uVar1;
  auVar91._8_4_ = uVar1;
  auVar91._12_4_ = uVar1;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar5 + 0x210);
  auVar83._4_4_ = uVar1;
  auVar83._0_4_ = uVar1;
  auVar83._8_4_ = uVar1;
  auVar83._12_4_ = uVar1;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar5 + 0x1b0);
  auVar11._4_4_ = uVar1;
  auVar11._0_4_ = uVar1;
  auVar11._8_4_ = uVar1;
  auVar11._12_4_ = uVar1;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar5 + 400);
  auVar58._4_4_ = uVar1;
  auVar58._0_4_ = uVar1;
  auVar58._8_4_ = uVar1;
  auVar58._12_4_ = uVar1;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar5 + 0x170);
  auVar67._4_4_ = uVar1;
  auVar67._0_4_ = uVar1;
  auVar67._8_4_ = uVar1;
  auVar67._12_4_ = uVar1;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar5 + 0x240);
  auVar100._4_4_ = uVar1;
  auVar100._0_4_ = uVar1;
  auVar100._8_4_ = uVar1;
  auVar100._12_4_ = uVar1;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar5 + 0x1c0);
  auVar69._4_4_ = uVar1;
  auVar69._0_4_ = uVar1;
  auVar69._8_4_ = uVar1;
  auVar69._12_4_ = uVar1;
  auVar71._4_4_ = iVar9;
  auVar71._0_4_ = iVar9;
  auVar71._8_4_ = iVar9;
  auVar71._12_4_ = iVar9;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar5 + 0x180);
  auVar113._4_4_ = uVar1;
  auVar113._0_4_ = uVar1;
  auVar113._8_4_ = uVar1;
  auVar113._12_4_ = uVar1;
  auVar48._4_4_ = iVar12;
  auVar48._0_4_ = iVar12;
  auVar48._8_4_ = iVar12;
  auVar48._12_4_ = iVar12;
  auVar81._4_4_ = iVar13;
  auVar81._0_4_ = iVar13;
  auVar81._8_4_ = iVar13;
  auVar81._12_4_ = iVar13;
  auVar15 = pmulld(auVar67,(undefined1  [16])in[1]);
  auVar67 = pmulld(auVar66,(undefined1  [16])in[1]);
  auVar49 = pmulld(auVar48,(undefined1  [16])in[7]);
  auVar92 = pmulld(auVar91,(undefined1  [16])in[7]);
  iVar14 = auVar15._0_4_ + iVar8 >> auVar20;
  iVar16 = auVar15._4_4_ + iVar8 >> auVar20;
  iVar17 = auVar15._8_4_ + iVar8 >> auVar20;
  iVar18 = auVar15._12_4_ + iVar8 >> auVar20;
  iVar64 = auVar67._0_4_ + iVar8 >> auVar20;
  iVar73 = auVar67._4_4_ + iVar8 >> auVar20;
  iVar75 = auVar67._8_4_ + iVar8 >> auVar20;
  iVar77 = auVar67._12_4_ + iVar8 >> auVar20;
  iVar45 = auVar49._0_4_ + iVar8 >> auVar20;
  iVar50 = auVar49._4_4_ + iVar8 >> auVar20;
  iVar52 = auVar49._8_4_ + iVar8 >> auVar20;
  iVar54 = auVar49._12_4_ + iVar8 >> auVar20;
  auVar15 = pmulld(auVar11,(undefined1  [16])in[5]);
  auVar49 = pmulld(auVar83,(undefined1  [16])in[5]);
  iVar90 = auVar92._0_4_ + iVar8 >> auVar20;
  iVar95 = auVar92._4_4_ + iVar8 >> auVar20;
  iVar96 = auVar92._8_4_ + iVar8 >> auVar20;
  iVar97 = auVar92._12_4_ + iVar8 >> auVar20;
  iVar9 = auVar15._0_4_ + iVar8 >> auVar20;
  iVar12 = auVar15._4_4_ + iVar8 >> auVar20;
  iVar13 = auVar15._8_4_ + iVar8 >> auVar20;
  iVar2 = auVar15._12_4_ + iVar8 >> auVar20;
  iVar37 = auVar49._0_4_ + iVar8 >> auVar20;
  iVar39 = auVar49._4_4_ + iVar8 >> auVar20;
  iVar41 = auVar49._8_4_ + iVar8 >> auVar20;
  iVar43 = auVar49._12_4_ + iVar8 >> auVar20;
  auVar49 = pmulld(auVar81,(undefined1  [16])in[3]);
  auVar15 = pmulld(auVar58,(undefined1  [16])in[3]);
  iVar79 = auVar49._0_4_ + iVar8 >> auVar20;
  iVar84 = auVar49._4_4_ + iVar8 >> auVar20;
  iVar86 = auVar49._8_4_ + iVar8 >> auVar20;
  iVar88 = auVar49._12_4_ + iVar8 >> auVar20;
  iVar57 = auVar15._0_4_ + iVar8 >> auVar20;
  iVar61 = auVar15._4_4_ + iVar8 >> auVar20;
  iVar62 = auVar15._8_4_ + iVar8 >> auVar20;
  iVar63 = auVar15._12_4_ + iVar8 >> auVar20;
  auVar15 = pmulld(auVar113,(undefined1  [16])in[2]);
  iVar112 = auVar15._0_4_ + iVar8 >> auVar20;
  iVar115 = auVar15._4_4_ + iVar8 >> auVar20;
  iVar116 = auVar15._8_4_ + iVar8 >> auVar20;
  iVar117 = auVar15._12_4_ + iVar8 >> auVar20;
  auVar15 = pmulld(auVar100,(undefined1  [16])in[2]);
  iVar98 = auVar15._0_4_ + iVar8 >> auVar20;
  iVar102 = auVar15._4_4_ + iVar8 >> auVar20;
  iVar104 = auVar15._8_4_ + iVar8 >> auVar20;
  iVar106 = auVar15._12_4_ + iVar8 >> auVar20;
  auVar15 = pmulld(auVar71,(undefined1  [16])in[6]);
  iVar32 = auVar15._0_4_ + iVar8 >> auVar20;
  iVar34 = auVar15._4_4_ + iVar8 >> auVar20;
  iVar35 = auVar15._8_4_ + iVar8 >> auVar20;
  iVar36 = auVar15._12_4_ + iVar8 >> auVar20;
  auVar15 = pmulld(auVar69,(undefined1  [16])in[6]);
  iVar28 = auVar15._0_4_ + iVar8 >> auVar20;
  iVar29 = auVar15._4_4_ + iVar8 >> auVar20;
  iVar30 = auVar15._8_4_ + iVar8 >> auVar20;
  iVar31 = auVar15._12_4_ + iVar8 >> auVar20;
  iVar19 = iVar45 + iVar64;
  iVar21 = iVar50 + iVar73;
  iVar22 = iVar52 + iVar75;
  iVar25 = iVar54 + iVar77;
  iVar64 = iVar64 - iVar45;
  iVar73 = iVar73 - iVar50;
  iVar75 = iVar75 - iVar52;
  iVar77 = iVar77 - iVar54;
  iVar45 = iVar79 + iVar37;
  iVar52 = iVar84 + iVar39;
  iVar23 = iVar86 + iVar41;
  iVar26 = iVar88 + iVar43;
  iVar79 = iVar79 - iVar37;
  iVar84 = iVar84 - iVar39;
  iVar86 = iVar86 - iVar41;
  iVar88 = iVar88 - iVar43;
  iVar50 = iVar57 + iVar9;
  iVar54 = iVar61 + iVar12;
  iVar24 = iVar62 + iVar13;
  iVar27 = iVar63 + iVar2;
  iVar57 = iVar57 - iVar9;
  iVar61 = iVar61 - iVar12;
  iVar62 = iVar62 - iVar13;
  iVar63 = iVar63 - iVar2;
  iVar38 = iVar90 + iVar14;
  iVar40 = iVar95 + iVar16;
  iVar42 = iVar96 + iVar17;
  iVar44 = iVar97 + iVar18;
  iVar14 = iVar14 - iVar90;
  iVar16 = iVar16 - iVar95;
  iVar17 = iVar17 - iVar96;
  iVar18 = iVar18 - iVar97;
  iVar37 = iVar32 + iVar98;
  iVar39 = iVar34 + iVar102;
  iVar41 = iVar35 + iVar104;
  iVar43 = iVar36 + iVar106;
  iVar98 = iVar98 - iVar32;
  iVar102 = iVar102 - iVar34;
  iVar104 = iVar104 - iVar35;
  iVar106 = iVar106 - iVar36;
  iVar12 = iVar28 + iVar112;
  iVar13 = iVar29 + iVar115;
  iVar32 = iVar30 + iVar116;
  iVar34 = iVar31 + iVar117;
  iVar112 = iVar112 - iVar28;
  iVar115 = iVar115 - iVar29;
  iVar116 = iVar116 - iVar30;
  iVar117 = iVar117 - iVar31;
  iVar9 = -iVar4;
  iVar4 = iVar4 + -1;
  auVar56._4_4_ = iVar10;
  auVar56._0_4_ = iVar10;
  auVar56._8_4_ = iVar10;
  auVar56._12_4_ = iVar10;
  auVar15._4_4_ = iVar7;
  auVar15._0_4_ = iVar7;
  auVar15._8_4_ = iVar7;
  auVar15._12_4_ = iVar7;
  uVar65 = (uint)(iVar64 < iVar9) * iVar9 | (uint)(iVar64 >= iVar9) * iVar64;
  uVar74 = (uint)(iVar73 < iVar9) * iVar9 | (uint)(iVar73 >= iVar9) * iVar73;
  uVar76 = (uint)(iVar75 < iVar9) * iVar9 | (uint)(iVar75 >= iVar9) * iVar75;
  uVar78 = (uint)(iVar77 < iVar9) * iVar9 | (uint)(iVar77 >= iVar9) * iVar77;
  auVar68._0_4_ = (uint)(iVar4 < (int)uVar65) * iVar4 | (iVar4 >= (int)uVar65) * uVar65;
  auVar68._4_4_ = (uint)(iVar4 < (int)uVar74) * iVar4 | (iVar4 >= (int)uVar74) * uVar74;
  auVar68._8_4_ = (uint)(iVar4 < (int)uVar76) * iVar4 | (iVar4 >= (int)uVar76) * uVar76;
  auVar68._12_4_ = (uint)(iVar4 < (int)uVar78) * iVar4 | (iVar4 >= (int)uVar78) * uVar78;
  uVar65 = (uint)(iVar14 < iVar9) * iVar9 | (uint)(iVar14 >= iVar9) * iVar14;
  uVar74 = (uint)(iVar16 < iVar9) * iVar9 | (uint)(iVar16 >= iVar9) * iVar16;
  uVar76 = (uint)(iVar17 < iVar9) * iVar9 | (uint)(iVar17 >= iVar9) * iVar17;
  uVar78 = (uint)(iVar18 < iVar9) * iVar9 | (uint)(iVar18 >= iVar9) * iVar18;
  auVar92._0_4_ = (uint)(iVar4 < (int)uVar65) * iVar4 | (iVar4 >= (int)uVar65) * uVar65;
  auVar92._4_4_ = (uint)(iVar4 < (int)uVar74) * iVar4 | (iVar4 >= (int)uVar74) * uVar74;
  auVar92._8_4_ = (uint)(iVar4 < (int)uVar76) * iVar4 | (iVar4 >= (int)uVar76) * uVar76;
  auVar92._12_4_ = (uint)(iVar4 < (int)uVar78) * iVar4 | (iVar4 >= (int)uVar78) * uVar78;
  auVar11 = pmulld(auVar68,auVar15);
  auVar93 = pmulld(auVar92,auVar56);
  auVar72._4_4_ = iVar46;
  auVar72._0_4_ = iVar46;
  auVar72._8_4_ = iVar46;
  auVar72._12_4_ = iVar46;
  auVar67 = pmulld((undefined1  [16])in[4],auVar72);
  auVar92 = pmulld(auVar92,auVar72);
  auVar69 = pmulld(auVar68,auVar56);
  auVar70._4_4_ = iVar6;
  auVar70._0_4_ = iVar6;
  auVar70._8_4_ = iVar6;
  auVar70._12_4_ = iVar6;
  uVar65 = (uint)(iVar79 < iVar9) * iVar9 | (uint)(iVar79 >= iVar9) * iVar79;
  uVar74 = (uint)(iVar84 < iVar9) * iVar9 | (uint)(iVar84 >= iVar9) * iVar84;
  uVar76 = (uint)(iVar86 < iVar9) * iVar9 | (uint)(iVar86 >= iVar9) * iVar86;
  uVar78 = (uint)(iVar88 < iVar9) * iVar9 | (uint)(iVar88 >= iVar9) * iVar88;
  auVar82._0_4_ = (uint)(iVar4 < (int)uVar65) * iVar4 | (iVar4 >= (int)uVar65) * uVar65;
  auVar82._4_4_ = (uint)(iVar4 < (int)uVar74) * iVar4 | (iVar4 >= (int)uVar74) * uVar74;
  auVar82._8_4_ = (uint)(iVar4 < (int)uVar76) * iVar4 | (iVar4 >= (int)uVar76) * uVar76;
  auVar82._12_4_ = (uint)(iVar4 < (int)uVar78) * iVar4 | (iVar4 >= (int)uVar78) * uVar78;
  uVar65 = (uint)(iVar57 < iVar9) * iVar9 | (uint)(iVar57 >= iVar9) * iVar57;
  uVar74 = (uint)(iVar61 < iVar9) * iVar9 | (uint)(iVar61 >= iVar9) * iVar61;
  uVar76 = (uint)(iVar62 < iVar9) * iVar9 | (uint)(iVar62 >= iVar9) * iVar62;
  uVar78 = (uint)(iVar63 < iVar9) * iVar9 | (uint)(iVar63 >= iVar9) * iVar63;
  auVar59._0_4_ = (uint)(iVar4 < (int)uVar65) * iVar4 | (iVar4 >= (int)uVar65) * uVar65;
  auVar59._4_4_ = (uint)(iVar4 < (int)uVar74) * iVar4 | (iVar4 >= (int)uVar74) * uVar74;
  auVar59._8_4_ = (uint)(iVar4 < (int)uVar76) * iVar4 | (iVar4 >= (int)uVar76) * uVar76;
  auVar59._12_4_ = (uint)(iVar4 < (int)uVar78) * iVar4 | (iVar4 >= (int)uVar78) * uVar78;
  auVar71 = pmulld(auVar70,auVar82);
  auVar33 = pmulld(auVar59,auVar15);
  auVar83 = pmulld(auVar82,auVar15);
  auVar15 = pmulld((undefined1  [16])in[4],auVar56);
  auVar60 = pmulld(auVar59,auVar56);
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar5 + 0x1e0);
  auVar49._4_4_ = uVar1;
  auVar49._0_4_ = uVar1;
  auVar49._8_4_ = uVar1;
  auVar49._12_4_ = uVar1;
  auVar72 = pmulld((undefined1  [16])*in,auVar49);
  iVar79 = auVar72._0_4_ + iVar8 >> auVar20;
  iVar84 = auVar72._4_4_ + iVar8 >> auVar20;
  iVar86 = auVar72._8_4_ + iVar8 >> auVar20;
  iVar88 = auVar72._12_4_ + iVar8 >> auVar20;
  iVar10 = auVar67._0_4_ + iVar8 >> auVar20;
  iVar6 = auVar67._4_4_ + iVar8 >> auVar20;
  iVar16 = auVar67._8_4_ + iVar8 >> auVar20;
  iVar17 = auVar67._12_4_ + iVar8 >> auVar20;
  iVar46 = auVar15._0_4_ + iVar8 >> auVar20;
  iVar2 = auVar15._4_4_ + iVar8 >> auVar20;
  iVar7 = auVar15._8_4_ + iVar8 >> auVar20;
  iVar14 = auVar15._12_4_ + iVar8 >> auVar20;
  iVar96 = iVar79 - iVar10;
  iVar97 = iVar84 - iVar6;
  iVar108 = iVar86 - iVar16;
  iVar110 = iVar88 - iVar17;
  iVar10 = iVar10 + iVar79;
  iVar6 = iVar6 + iVar84;
  iVar16 = iVar16 + iVar86;
  iVar17 = iVar17 + iVar88;
  iVar36 = iVar46 + iVar79;
  iVar77 = iVar2 + iVar84;
  iVar90 = iVar7 + iVar86;
  iVar95 = iVar14 + iVar88;
  iVar79 = iVar79 - iVar46;
  iVar84 = iVar84 - iVar2;
  iVar86 = iVar86 - iVar7;
  iVar88 = iVar88 - iVar14;
  uVar65 = (uint)(iVar98 < iVar9) * iVar9 | (uint)(iVar98 >= iVar9) * iVar98;
  uVar74 = (uint)(iVar102 < iVar9) * iVar9 | (uint)(iVar102 >= iVar9) * iVar102;
  uVar76 = (uint)(iVar104 < iVar9) * iVar9 | (uint)(iVar104 >= iVar9) * iVar104;
  uVar78 = (uint)(iVar106 < iVar9) * iVar9 | (uint)(iVar106 >= iVar9) * iVar106;
  auVar101._0_4_ = (uint)(iVar4 < (int)uVar65) * iVar4 | (iVar4 >= (int)uVar65) * uVar65;
  auVar101._4_4_ = (uint)(iVar4 < (int)uVar74) * iVar4 | (iVar4 >= (int)uVar74) * uVar74;
  auVar101._8_4_ = (uint)(iVar4 < (int)uVar76) * iVar4 | (iVar4 >= (int)uVar76) * uVar76;
  auVar101._12_4_ = (uint)(iVar4 < (int)uVar78) * iVar4 | (iVar4 >= (int)uVar78) * uVar78;
  uVar65 = (uint)(iVar112 < iVar9) * iVar9 | (uint)(iVar112 >= iVar9) * iVar112;
  uVar74 = (uint)(iVar115 < iVar9) * iVar9 | (uint)(iVar115 >= iVar9) * iVar115;
  uVar76 = (uint)(iVar116 < iVar9) * iVar9 | (uint)(iVar116 >= iVar9) * iVar116;
  uVar78 = (uint)(iVar117 < iVar9) * iVar9 | (uint)(iVar117 >= iVar9) * iVar117;
  auVar114._0_4_ = (uint)(iVar4 < (int)uVar65) * iVar4 | (iVar4 >= (int)uVar65) * uVar65;
  auVar114._4_4_ = (uint)(iVar4 < (int)uVar74) * iVar4 | (iVar4 >= (int)uVar74) * uVar74;
  auVar114._8_4_ = (uint)(iVar4 < (int)uVar76) * iVar4 | (iVar4 >= (int)uVar76) * uVar76;
  auVar114._12_4_ = (uint)(iVar4 < (int)uVar78) * iVar4 | (iVar4 >= (int)uVar78) * uVar78;
  auVar15 = pmulld(auVar101,auVar49);
  auVar67 = pmulld(auVar114,auVar49);
  uVar65 = (uint)(iVar19 < iVar9) * iVar9 | (uint)(iVar19 >= iVar9) * iVar19;
  uVar74 = (uint)(iVar21 < iVar9) * iVar9 | (uint)(iVar21 >= iVar9) * iVar21;
  uVar76 = (uint)(iVar22 < iVar9) * iVar9 | (uint)(iVar22 >= iVar9) * iVar22;
  uVar78 = (uint)(iVar25 < iVar9) * iVar9 | (uint)(iVar25 >= iVar9) * iVar25;
  uVar47 = (uint)(iVar4 < (int)uVar65) * iVar4 | (iVar4 >= (int)uVar65) * uVar65;
  uVar51 = (uint)(iVar4 < (int)uVar74) * iVar4 | (iVar4 >= (int)uVar74) * uVar74;
  uVar53 = (uint)(iVar4 < (int)uVar76) * iVar4 | (iVar4 >= (int)uVar76) * uVar76;
  uVar55 = (uint)(iVar4 < (int)uVar78) * iVar4 | (iVar4 >= (int)uVar78) * uVar78;
  uVar65 = (uint)(iVar45 < iVar9) * iVar9 | (uint)(iVar45 >= iVar9) * iVar45;
  uVar74 = (uint)(iVar52 < iVar9) * iVar9 | (uint)(iVar52 >= iVar9) * iVar52;
  uVar76 = (uint)(iVar23 < iVar9) * iVar9 | (uint)(iVar23 >= iVar9) * iVar23;
  uVar78 = (uint)(iVar26 < iVar9) * iVar9 | (uint)(iVar26 >= iVar9) * iVar26;
  uVar65 = (uint)(iVar4 < (int)uVar65) * iVar4 | (iVar4 >= (int)uVar65) * uVar65;
  uVar74 = (uint)(iVar4 < (int)uVar74) * iVar4 | (iVar4 >= (int)uVar74) * uVar74;
  uVar76 = (uint)(iVar4 < (int)uVar76) * iVar4 | (iVar4 >= (int)uVar76) * uVar76;
  uVar78 = (uint)(iVar4 < (int)uVar78) * iVar4 | (iVar4 >= (int)uVar78) * uVar78;
  iVar99 = uVar65 + uVar47;
  iVar103 = uVar74 + uVar51;
  iVar105 = uVar76 + uVar53;
  iVar107 = uVar78 + uVar55;
  iVar30 = uVar47 - uVar65;
  iVar57 = uVar51 - uVar74;
  iVar62 = uVar53 - uVar76;
  iVar64 = uVar55 - uVar78;
  iVar112 = auVar93._0_4_ + iVar8 + auVar11._0_4_ >> auVar20;
  iVar115 = auVar93._4_4_ + iVar8 + auVar11._4_4_ >> auVar20;
  iVar116 = auVar93._8_4_ + iVar8 + auVar11._8_4_ >> auVar20;
  iVar117 = auVar93._12_4_ + iVar8 + auVar11._12_4_ >> auVar20;
  iVar46 = auVar33._0_4_ + iVar8 + auVar71._0_4_ >> auVar20;
  iVar2 = auVar33._4_4_ + iVar8 + auVar71._4_4_ >> auVar20;
  iVar7 = auVar33._8_4_ + iVar8 + auVar71._8_4_ >> auVar20;
  iVar14 = auVar33._12_4_ + iVar8 + auVar71._12_4_ >> auVar20;
  iVar31 = iVar46 + iVar112;
  iVar61 = iVar2 + iVar115;
  iVar63 = iVar7 + iVar116;
  iVar73 = iVar14 + iVar117;
  iVar112 = iVar112 - iVar46;
  iVar115 = iVar115 - iVar2;
  iVar116 = iVar116 - iVar7;
  iVar117 = iVar117 - iVar14;
  uVar65 = (uint)(iVar50 < iVar9) * iVar9 | (uint)(iVar50 >= iVar9) * iVar50;
  uVar74 = (uint)(iVar54 < iVar9) * iVar9 | (uint)(iVar54 >= iVar9) * iVar54;
  uVar76 = (uint)(iVar24 < iVar9) * iVar9 | (uint)(iVar24 >= iVar9) * iVar24;
  uVar78 = (uint)(iVar27 < iVar9) * iVar9 | (uint)(iVar27 >= iVar9) * iVar27;
  uVar65 = (uint)(iVar4 < (int)uVar65) * iVar4 | (iVar4 >= (int)uVar65) * uVar65;
  uVar74 = (uint)(iVar4 < (int)uVar74) * iVar4 | (iVar4 >= (int)uVar74) * uVar74;
  uVar76 = (uint)(iVar4 < (int)uVar76) * iVar4 | (iVar4 >= (int)uVar76) * uVar76;
  uVar78 = (uint)(iVar4 < (int)uVar78) * iVar4 | (iVar4 >= (int)uVar78) * uVar78;
  uVar47 = (uint)(iVar38 < iVar9) * iVar9 | (uint)(iVar38 >= iVar9) * iVar38;
  uVar51 = (uint)(iVar40 < iVar9) * iVar9 | (uint)(iVar40 >= iVar9) * iVar40;
  uVar53 = (uint)(iVar42 < iVar9) * iVar9 | (uint)(iVar42 >= iVar9) * iVar42;
  uVar55 = (uint)(iVar44 < iVar9) * iVar9 | (uint)(iVar44 >= iVar9) * iVar44;
  uVar47 = (uint)(iVar4 < (int)uVar47) * iVar4 | (iVar4 >= (int)uVar47) * uVar47;
  uVar51 = (uint)(iVar4 < (int)uVar51) * iVar4 | (iVar4 >= (int)uVar51) * uVar51;
  uVar53 = (uint)(iVar4 < (int)uVar53) * iVar4 | (iVar4 >= (int)uVar53) * uVar53;
  uVar55 = (uint)(iVar4 < (int)uVar55) * iVar4 | (iVar4 >= (int)uVar55) * uVar55;
  iVar35 = uVar65 + uVar47;
  iVar38 = uVar74 + uVar51;
  iVar42 = uVar76 + uVar53;
  iVar75 = uVar78 + uVar55;
  iVar26 = uVar47 - uVar65;
  iVar27 = uVar51 - uVar74;
  iVar28 = uVar53 - uVar76;
  iVar29 = uVar55 - uVar78;
  iVar50 = auVar92._0_4_ + iVar8 + auVar69._0_4_ >> auVar20;
  iVar21 = auVar92._4_4_ + iVar8 + auVar69._4_4_ >> auVar20;
  iVar52 = auVar92._8_4_ + iVar8 + auVar69._8_4_ >> auVar20;
  iVar54 = auVar92._12_4_ + iVar8 + auVar69._12_4_ >> auVar20;
  iVar18 = auVar60._0_4_ + iVar8 + auVar83._0_4_ >> auVar20;
  iVar19 = auVar60._4_4_ + iVar8 + auVar83._4_4_ >> auVar20;
  iVar45 = auVar60._8_4_ + iVar8 + auVar83._8_4_ >> auVar20;
  iVar22 = auVar60._12_4_ + iVar8 + auVar83._12_4_ >> auVar20;
  iVar46 = iVar18 + iVar50;
  iVar2 = iVar19 + iVar21;
  iVar7 = iVar45 + iVar52;
  iVar14 = iVar22 + iVar54;
  iVar50 = iVar50 - iVar18;
  iVar21 = iVar21 - iVar19;
  iVar52 = iVar52 - iVar45;
  iVar54 = iVar54 - iVar22;
  uVar65 = (uint)(iVar12 < iVar9) * iVar9 | (uint)(iVar12 >= iVar9) * iVar12;
  uVar74 = (uint)(iVar13 < iVar9) * iVar9 | (uint)(iVar13 >= iVar9) * iVar13;
  uVar76 = (uint)(iVar32 < iVar9) * iVar9 | (uint)(iVar32 >= iVar9) * iVar32;
  uVar78 = (uint)(iVar34 < iVar9) * iVar9 | (uint)(iVar34 >= iVar9) * iVar34;
  uVar65 = (uint)(iVar4 < (int)uVar65) * iVar4 | (iVar4 >= (int)uVar65) * uVar65;
  uVar74 = (uint)(iVar4 < (int)uVar74) * iVar4 | (iVar4 >= (int)uVar74) * uVar74;
  uVar76 = (uint)(iVar4 < (int)uVar76) * iVar4 | (iVar4 >= (int)uVar76) * uVar76;
  uVar78 = (uint)(iVar4 < (int)uVar78) * iVar4 | (iVar4 >= (int)uVar78) * uVar78;
  uVar47 = (uint)(iVar10 < iVar9) * iVar9 | (uint)(iVar10 >= iVar9) * iVar10;
  uVar51 = (uint)(iVar6 < iVar9) * iVar9 | (uint)(iVar6 >= iVar9) * iVar6;
  uVar53 = (uint)(iVar16 < iVar9) * iVar9 | (uint)(iVar16 >= iVar9) * iVar16;
  uVar55 = (uint)(iVar17 < iVar9) * iVar9 | (uint)(iVar17 >= iVar9) * iVar17;
  uVar47 = (uint)(iVar4 < (int)uVar47) * iVar4 | (iVar4 >= (int)uVar47) * uVar47;
  uVar51 = (uint)(iVar4 < (int)uVar51) * iVar4 | (iVar4 >= (int)uVar51) * uVar51;
  uVar53 = (uint)(iVar4 < (int)uVar53) * iVar4 | (iVar4 >= (int)uVar53) * uVar53;
  uVar55 = (uint)(iVar4 < (int)uVar55) * iVar4 | (iVar4 >= (int)uVar55) * uVar55;
  iVar22 = uVar47 + uVar65;
  iVar23 = uVar51 + uVar74;
  iVar24 = uVar53 + uVar76;
  iVar25 = uVar55 + uVar78;
  iVar17 = uVar47 - uVar65;
  iVar18 = uVar51 - uVar74;
  iVar19 = uVar53 - uVar76;
  iVar45 = uVar55 - uVar78;
  uVar65 = (uint)(iVar36 < iVar9) * iVar9 | (uint)(iVar36 >= iVar9) * iVar36;
  uVar74 = (uint)(iVar77 < iVar9) * iVar9 | (uint)(iVar77 >= iVar9) * iVar77;
  uVar76 = (uint)(iVar90 < iVar9) * iVar9 | (uint)(iVar90 >= iVar9) * iVar90;
  uVar78 = (uint)(iVar95 < iVar9) * iVar9 | (uint)(iVar95 >= iVar9) * iVar95;
  uVar65 = (uint)(iVar4 < (int)uVar65) * iVar4 | (iVar4 >= (int)uVar65) * uVar65;
  uVar74 = (uint)(iVar4 < (int)uVar74) * iVar4 | (iVar4 >= (int)uVar74) * uVar74;
  uVar76 = (uint)(iVar4 < (int)uVar76) * iVar4 | (iVar4 >= (int)uVar76) * uVar76;
  uVar78 = (uint)(iVar4 < (int)uVar78) * iVar4 | (iVar4 >= (int)uVar78) * uVar78;
  iVar98 = auVar67._0_4_ + iVar8 + auVar15._0_4_ >> auVar20;
  iVar102 = auVar67._4_4_ + iVar8 + auVar15._4_4_ >> auVar20;
  iVar104 = auVar67._8_4_ + iVar8 + auVar15._8_4_ >> auVar20;
  iVar106 = auVar67._12_4_ + iVar8 + auVar15._12_4_ >> auVar20;
  iVar36 = iVar98 + uVar65;
  iVar40 = iVar102 + uVar74;
  iVar44 = iVar104 + uVar76;
  iVar77 = iVar106 + uVar78;
  iVar98 = uVar65 - iVar98;
  iVar102 = uVar74 - iVar102;
  iVar104 = uVar76 - iVar104;
  iVar106 = uVar78 - iVar106;
  uVar65 = (uint)(iVar79 < iVar9) * iVar9 | (uint)(iVar79 >= iVar9) * iVar79;
  uVar74 = (uint)(iVar84 < iVar9) * iVar9 | (uint)(iVar84 >= iVar9) * iVar84;
  uVar76 = (uint)(iVar86 < iVar9) * iVar9 | (uint)(iVar86 >= iVar9) * iVar86;
  uVar78 = (uint)(iVar88 < iVar9) * iVar9 | (uint)(iVar88 >= iVar9) * iVar88;
  uVar65 = (uint)(iVar4 < (int)uVar65) * iVar4 | (iVar4 >= (int)uVar65) * uVar65;
  uVar74 = (uint)(iVar4 < (int)uVar74) * iVar4 | (iVar4 >= (int)uVar74) * uVar74;
  uVar76 = (uint)(iVar4 < (int)uVar76) * iVar4 | (iVar4 >= (int)uVar76) * uVar76;
  uVar78 = (uint)(iVar4 < (int)uVar78) * iVar4 | (iVar4 >= (int)uVar78) * uVar78;
  iVar79 = (iVar8 - auVar15._0_4_) + auVar67._0_4_ >> auVar20;
  iVar84 = (iVar8 - auVar15._4_4_) + auVar67._4_4_ >> auVar20;
  iVar86 = (iVar8 - auVar15._8_4_) + auVar67._8_4_ >> auVar20;
  iVar88 = (iVar8 - auVar15._12_4_) + auVar67._12_4_ >> auVar20;
  iVar10 = iVar79 + uVar65;
  iVar13 = iVar84 + uVar74;
  iVar32 = iVar86 + uVar76;
  iVar16 = iVar88 + uVar78;
  iVar79 = uVar65 - iVar79;
  iVar84 = uVar74 - iVar84;
  iVar86 = uVar76 - iVar86;
  iVar88 = uVar78 - iVar88;
  uVar65 = (uint)(iVar37 < iVar9) * iVar9 | (uint)(iVar37 >= iVar9) * iVar37;
  uVar74 = (uint)(iVar39 < iVar9) * iVar9 | (uint)(iVar39 >= iVar9) * iVar39;
  uVar76 = (uint)(iVar41 < iVar9) * iVar9 | (uint)(iVar41 >= iVar9) * iVar41;
  uVar78 = (uint)(iVar43 < iVar9) * iVar9 | (uint)(iVar43 >= iVar9) * iVar43;
  uVar65 = (uint)(iVar4 < (int)uVar65) * iVar4 | (iVar4 >= (int)uVar65) * uVar65;
  uVar74 = (uint)(iVar4 < (int)uVar74) * iVar4 | (iVar4 >= (int)uVar74) * uVar74;
  uVar76 = (uint)(iVar4 < (int)uVar76) * iVar4 | (iVar4 >= (int)uVar76) * uVar76;
  uVar78 = (uint)(iVar4 < (int)uVar78) * iVar4 | (iVar4 >= (int)uVar78) * uVar78;
  uVar47 = (uint)(iVar96 < iVar9) * iVar9 | (uint)(iVar96 >= iVar9) * iVar96;
  uVar51 = (uint)(iVar97 < iVar9) * iVar9 | (uint)(iVar97 >= iVar9) * iVar97;
  uVar53 = (uint)(iVar108 < iVar9) * iVar9 | (uint)(iVar108 >= iVar9) * iVar108;
  uVar55 = (uint)(iVar110 < iVar9) * iVar9 | (uint)(iVar110 >= iVar9) * iVar110;
  uVar47 = (uint)(iVar4 < (int)uVar47) * iVar4 | (iVar4 >= (int)uVar47) * uVar47;
  uVar51 = (uint)(iVar4 < (int)uVar51) * iVar4 | (iVar4 >= (int)uVar51) * uVar51;
  uVar53 = (uint)(iVar4 < (int)uVar53) * iVar4 | (iVar4 >= (int)uVar53) * uVar53;
  uVar55 = (uint)(iVar4 < (int)uVar55) * iVar4 | (iVar4 >= (int)uVar55) * uVar55;
  iVar90 = uVar47 + uVar65;
  iVar95 = uVar51 + uVar74;
  iVar96 = uVar53 + uVar76;
  iVar97 = uVar55 + uVar78;
  iVar108 = uVar47 - uVar65;
  iVar110 = uVar51 - uVar74;
  iVar109 = uVar53 - uVar76;
  iVar111 = uVar55 - uVar78;
  uVar65 = (uint)(iVar112 < iVar9) * iVar9 | (uint)(iVar112 >= iVar9) * iVar112;
  uVar74 = (uint)(iVar115 < iVar9) * iVar9 | (uint)(iVar115 >= iVar9) * iVar115;
  uVar76 = (uint)(iVar116 < iVar9) * iVar9 | (uint)(iVar116 >= iVar9) * iVar116;
  uVar78 = (uint)(iVar117 < iVar9) * iVar9 | (uint)(iVar117 >= iVar9) * iVar117;
  auVar94._0_4_ = (uint)(iVar4 < (int)uVar65) * iVar4 | (iVar4 >= (int)uVar65) * uVar65;
  auVar94._4_4_ = (uint)(iVar4 < (int)uVar74) * iVar4 | (iVar4 >= (int)uVar74) * uVar74;
  auVar94._8_4_ = (uint)(iVar4 < (int)uVar76) * iVar4 | (iVar4 >= (int)uVar76) * uVar76;
  auVar94._12_4_ = (uint)(iVar4 < (int)uVar78) * iVar4 | (iVar4 >= (int)uVar78) * uVar78;
  uVar65 = (uint)(iVar50 < iVar9) * iVar9 | (uint)(iVar50 >= iVar9) * iVar50;
  uVar74 = (uint)(iVar21 < iVar9) * iVar9 | (uint)(iVar21 >= iVar9) * iVar21;
  uVar76 = (uint)(iVar52 < iVar9) * iVar9 | (uint)(iVar52 >= iVar9) * iVar52;
  uVar78 = (uint)(iVar54 < iVar9) * iVar9 | (uint)(iVar54 >= iVar9) * iVar54;
  auVar33._0_4_ = (uint)(iVar4 < (int)uVar65) * iVar4 | (iVar4 >= (int)uVar65) * uVar65;
  auVar33._4_4_ = (uint)(iVar4 < (int)uVar74) * iVar4 | (iVar4 >= (int)uVar74) * uVar74;
  auVar33._8_4_ = (uint)(iVar4 < (int)uVar76) * iVar4 | (iVar4 >= (int)uVar76) * uVar76;
  auVar33._12_4_ = (uint)(iVar4 < (int)uVar78) * iVar4 | (iVar4 >= (int)uVar78) * uVar78;
  auVar67 = pmulld(auVar94,auVar49);
  auVar15 = pmulld(auVar33,auVar49);
  uVar65 = (uint)(iVar30 < iVar9) * iVar9 | (uint)(iVar30 >= iVar9) * iVar30;
  uVar74 = (uint)(iVar57 < iVar9) * iVar9 | (uint)(iVar57 >= iVar9) * iVar57;
  uVar76 = (uint)(iVar62 < iVar9) * iVar9 | (uint)(iVar62 >= iVar9) * iVar62;
  uVar78 = (uint)(iVar64 < iVar9) * iVar9 | (uint)(iVar64 >= iVar9) * iVar64;
  auVar60._0_4_ = (uint)(iVar4 < (int)uVar65) * iVar4 | (iVar4 >= (int)uVar65) * uVar65;
  auVar60._4_4_ = (uint)(iVar4 < (int)uVar74) * iVar4 | (iVar4 >= (int)uVar74) * uVar74;
  auVar60._8_4_ = (uint)(iVar4 < (int)uVar76) * iVar4 | (iVar4 >= (int)uVar76) * uVar76;
  auVar60._12_4_ = (uint)(iVar4 < (int)uVar78) * iVar4 | (iVar4 >= (int)uVar78) * uVar78;
  uVar65 = (uint)(iVar26 < iVar9) * iVar9 | (uint)(iVar26 >= iVar9) * iVar26;
  uVar74 = (uint)(iVar27 < iVar9) * iVar9 | (uint)(iVar27 >= iVar9) * iVar27;
  uVar76 = (uint)(iVar28 < iVar9) * iVar9 | (uint)(iVar28 >= iVar9) * iVar28;
  uVar78 = (uint)(iVar29 < iVar9) * iVar9 | (uint)(iVar29 >= iVar9) * iVar29;
  auVar93._0_4_ = (uint)(iVar4 < (int)uVar65) * iVar4 | (iVar4 >= (int)uVar65) * uVar65;
  auVar93._4_4_ = (uint)(iVar4 < (int)uVar74) * iVar4 | (iVar4 >= (int)uVar74) * uVar74;
  auVar93._8_4_ = (uint)(iVar4 < (int)uVar76) * iVar4 | (iVar4 >= (int)uVar76) * uVar76;
  auVar93._12_4_ = (uint)(iVar4 < (int)uVar78) * iVar4 | (iVar4 >= (int)uVar78) * uVar78;
  auVar11 = pmulld(auVar60,auVar49);
  auVar49 = pmulld(auVar93,auVar49);
  iVar30 = (iVar8 - auVar67._0_4_) + auVar15._0_4_ >> auVar20;
  iVar57 = (iVar8 - auVar67._4_4_) + auVar15._4_4_ >> auVar20;
  iVar62 = (iVar8 - auVar67._8_4_) + auVar15._8_4_ >> auVar20;
  iVar64 = (iVar8 - auVar67._12_4_) + auVar15._12_4_ >> auVar20;
  iVar12 = auVar67._0_4_ + iVar8 + auVar15._0_4_ >> auVar20;
  iVar6 = auVar67._4_4_ + iVar8 + auVar15._4_4_ >> auVar20;
  iVar34 = auVar67._8_4_ + iVar8 + auVar15._8_4_ >> auVar20;
  iVar37 = auVar67._12_4_ + iVar8 + auVar15._12_4_ >> auVar20;
  iVar26 = (iVar8 - auVar11._0_4_) + auVar49._0_4_ >> auVar20;
  iVar27 = (iVar8 - auVar11._4_4_) + auVar49._4_4_ >> auVar20;
  iVar28 = (iVar8 - auVar11._8_4_) + auVar49._8_4_ >> auVar20;
  iVar29 = (iVar8 - auVar11._12_4_) + auVar49._12_4_ >> auVar20;
  iVar50 = auVar49._0_4_ + iVar8 + auVar11._0_4_ >> auVar20;
  iVar21 = auVar49._4_4_ + iVar8 + auVar11._4_4_ >> auVar20;
  iVar52 = auVar49._8_4_ + iVar8 + auVar11._8_4_ >> auVar20;
  iVar54 = auVar49._12_4_ + iVar8 + auVar11._12_4_ >> auVar20;
  uVar65 = (uint)(iVar35 < iVar9) * iVar9 | (uint)(iVar35 >= iVar9) * iVar35;
  uVar74 = (uint)(iVar38 < iVar9) * iVar9 | (uint)(iVar38 >= iVar9) * iVar38;
  uVar76 = (uint)(iVar42 < iVar9) * iVar9 | (uint)(iVar42 >= iVar9) * iVar42;
  uVar78 = (uint)(iVar75 < iVar9) * iVar9 | (uint)(iVar75 >= iVar9) * iVar75;
  uVar65 = (uint)(iVar4 < (int)uVar65) * iVar4 | (iVar4 >= (int)uVar65) * uVar65;
  uVar74 = (uint)(iVar4 < (int)uVar74) * iVar4 | (iVar4 >= (int)uVar74) * uVar74;
  uVar76 = (uint)(iVar4 < (int)uVar76) * iVar4 | (iVar4 >= (int)uVar76) * uVar76;
  uVar78 = (uint)(iVar4 < (int)uVar78) * iVar4 | (iVar4 >= (int)uVar78) * uVar78;
  uVar47 = (uint)(iVar22 < iVar9) * iVar9 | (uint)(iVar22 >= iVar9) * iVar22;
  uVar51 = (uint)(iVar23 < iVar9) * iVar9 | (uint)(iVar23 >= iVar9) * iVar23;
  uVar53 = (uint)(iVar24 < iVar9) * iVar9 | (uint)(iVar24 >= iVar9) * iVar24;
  uVar55 = (uint)(iVar25 < iVar9) * iVar9 | (uint)(iVar25 >= iVar9) * iVar25;
  uVar47 = (uint)(iVar4 < (int)uVar47) * iVar4 | (iVar4 >= (int)uVar47) * uVar47;
  uVar51 = (uint)(iVar4 < (int)uVar51) * iVar4 | (iVar4 >= (int)uVar51) * uVar51;
  uVar53 = (uint)(iVar4 < (int)uVar53) * iVar4 | (iVar4 >= (int)uVar53) * uVar53;
  uVar55 = (uint)(iVar4 < (int)uVar55) * iVar4 | (iVar4 >= (int)uVar55) * uVar55;
  iVar22 = uVar47 + uVar65;
  iVar23 = uVar51 + uVar74;
  iVar24 = uVar53 + uVar76;
  iVar25 = uVar55 + uVar78;
  iVar8 = uVar47 - uVar65;
  iVar39 = uVar51 - uVar74;
  iVar41 = uVar53 - uVar76;
  iVar43 = uVar55 - uVar78;
  uVar65 = (uint)(iVar22 < iVar9) * iVar9 | (uint)(iVar22 >= iVar9) * iVar22;
  uVar74 = (uint)(iVar23 < iVar9) * iVar9 | (uint)(iVar23 >= iVar9) * iVar23;
  uVar76 = (uint)(iVar24 < iVar9) * iVar9 | (uint)(iVar24 >= iVar9) * iVar24;
  uVar78 = (uint)(iVar25 < iVar9) * iVar9 | (uint)(iVar25 >= iVar9) * iVar25;
  *(uint *)*out = (uint)(iVar4 < (int)uVar65) * iVar4 | (iVar4 >= (int)uVar65) * uVar65;
  *(uint *)((long)*out + 4) = (uint)(iVar4 < (int)uVar74) * iVar4 | (iVar4 >= (int)uVar74) * uVar74;
  *(uint *)(*out + 1) = (uint)(iVar4 < (int)uVar76) * iVar4 | (iVar4 >= (int)uVar76) * uVar76;
  *(uint *)((long)*out + 0xc) =
       (uint)(iVar4 < (int)uVar78) * iVar4 | (iVar4 >= (int)uVar78) * uVar78;
  uVar65 = (uint)(iVar8 < iVar9) * iVar9 | (uint)(iVar8 >= iVar9) * iVar8;
  uVar74 = (uint)(iVar39 < iVar9) * iVar9 | (uint)(iVar39 >= iVar9) * iVar39;
  uVar76 = (uint)(iVar41 < iVar9) * iVar9 | (uint)(iVar41 >= iVar9) * iVar41;
  uVar78 = (uint)(iVar43 < iVar9) * iVar9 | (uint)(iVar43 >= iVar9) * iVar43;
  *(uint *)out[0xf] = (uint)(iVar4 < (int)uVar65) * iVar4 | (iVar4 >= (int)uVar65) * uVar65;
  *(uint *)((long)out[0xf] + 4) =
       (uint)(iVar4 < (int)uVar74) * iVar4 | (iVar4 >= (int)uVar74) * uVar74;
  *(uint *)(out[0xf] + 1) = (uint)(iVar4 < (int)uVar76) * iVar4 | (iVar4 >= (int)uVar76) * uVar76;
  *(uint *)((long)out[0xf] + 0xc) =
       (uint)(iVar4 < (int)uVar78) * iVar4 | (iVar4 >= (int)uVar78) * uVar78;
  uVar65 = (uint)(iVar46 < iVar9) * iVar9 | (uint)(iVar46 >= iVar9) * iVar46;
  uVar74 = (uint)(iVar2 < iVar9) * iVar9 | (uint)(iVar2 >= iVar9) * iVar2;
  uVar76 = (uint)(iVar7 < iVar9) * iVar9 | (uint)(iVar7 >= iVar9) * iVar7;
  uVar78 = (uint)(iVar14 < iVar9) * iVar9 | (uint)(iVar14 >= iVar9) * iVar14;
  uVar65 = (uint)(iVar4 < (int)uVar65) * iVar4 | (iVar4 >= (int)uVar65) * uVar65;
  uVar74 = (uint)(iVar4 < (int)uVar74) * iVar4 | (iVar4 >= (int)uVar74) * uVar74;
  uVar76 = (uint)(iVar4 < (int)uVar76) * iVar4 | (iVar4 >= (int)uVar76) * uVar76;
  uVar78 = (uint)(iVar4 < (int)uVar78) * iVar4 | (iVar4 >= (int)uVar78) * uVar78;
  uVar47 = (uint)(iVar36 < iVar9) * iVar9 | (uint)(iVar36 >= iVar9) * iVar36;
  uVar51 = (uint)(iVar40 < iVar9) * iVar9 | (uint)(iVar40 >= iVar9) * iVar40;
  uVar53 = (uint)(iVar44 < iVar9) * iVar9 | (uint)(iVar44 >= iVar9) * iVar44;
  uVar55 = (uint)(iVar77 < iVar9) * iVar9 | (uint)(iVar77 >= iVar9) * iVar77;
  uVar47 = (uint)(iVar4 < (int)uVar47) * iVar4 | (iVar4 >= (int)uVar47) * uVar47;
  uVar51 = (uint)(iVar4 < (int)uVar51) * iVar4 | (iVar4 >= (int)uVar51) * uVar51;
  uVar53 = (uint)(iVar4 < (int)uVar53) * iVar4 | (iVar4 >= (int)uVar53) * uVar53;
  uVar55 = (uint)(iVar4 < (int)uVar55) * iVar4 | (iVar4 >= (int)uVar55) * uVar55;
  iVar46 = uVar47 + uVar65;
  iVar2 = uVar51 + uVar74;
  iVar7 = uVar53 + uVar76;
  iVar8 = uVar55 + uVar78;
  iVar14 = uVar47 - uVar65;
  iVar39 = uVar51 - uVar74;
  iVar41 = uVar53 - uVar76;
  iVar43 = uVar55 - uVar78;
  uVar65 = (uint)(iVar46 < iVar9) * iVar9 | (uint)(iVar46 >= iVar9) * iVar46;
  uVar74 = (uint)(iVar2 < iVar9) * iVar9 | (uint)(iVar2 >= iVar9) * iVar2;
  uVar76 = (uint)(iVar7 < iVar9) * iVar9 | (uint)(iVar7 >= iVar9) * iVar7;
  uVar78 = (uint)(iVar8 < iVar9) * iVar9 | (uint)(iVar8 >= iVar9) * iVar8;
  *(uint *)out[1] = (uint)(iVar4 < (int)uVar65) * iVar4 | (iVar4 >= (int)uVar65) * uVar65;
  *(uint *)((long)out[1] + 4) =
       (uint)(iVar4 < (int)uVar74) * iVar4 | (iVar4 >= (int)uVar74) * uVar74;
  *(uint *)(out[1] + 1) = (uint)(iVar4 < (int)uVar76) * iVar4 | (iVar4 >= (int)uVar76) * uVar76;
  *(uint *)((long)out[1] + 0xc) =
       (uint)(iVar4 < (int)uVar78) * iVar4 | (iVar4 >= (int)uVar78) * uVar78;
  uVar65 = (uint)(iVar10 < iVar9) * iVar9 | (uint)(iVar10 >= iVar9) * iVar10;
  uVar74 = (uint)(iVar13 < iVar9) * iVar9 | (uint)(iVar13 >= iVar9) * iVar13;
  uVar76 = (uint)(iVar32 < iVar9) * iVar9 | (uint)(iVar32 >= iVar9) * iVar32;
  uVar78 = (uint)(iVar16 < iVar9) * iVar9 | (uint)(iVar16 >= iVar9) * iVar16;
  uVar65 = (uint)(iVar4 < (int)uVar65) * iVar4 | (iVar4 >= (int)uVar65) * uVar65;
  uVar74 = (uint)(iVar4 < (int)uVar74) * iVar4 | (iVar4 >= (int)uVar74) * uVar74;
  uVar76 = (uint)(iVar4 < (int)uVar76) * iVar4 | (iVar4 >= (int)uVar76) * uVar76;
  uVar78 = (uint)(iVar4 < (int)uVar78) * iVar4 | (iVar4 >= (int)uVar78) * uVar78;
  uVar47 = (uint)(iVar14 < iVar9) * iVar9 | (uint)(iVar14 >= iVar9) * iVar14;
  uVar51 = (uint)(iVar39 < iVar9) * iVar9 | (uint)(iVar39 >= iVar9) * iVar39;
  uVar53 = (uint)(iVar41 < iVar9) * iVar9 | (uint)(iVar41 >= iVar9) * iVar41;
  uVar55 = (uint)(iVar43 < iVar9) * iVar9 | (uint)(iVar43 >= iVar9) * iVar43;
  *(uint *)out[0xe] = (uint)(iVar4 < (int)uVar47) * iVar4 | (iVar4 >= (int)uVar47) * uVar47;
  *(uint *)((long)out[0xe] + 4) =
       (uint)(iVar4 < (int)uVar51) * iVar4 | (iVar4 >= (int)uVar51) * uVar51;
  *(uint *)(out[0xe] + 1) = (uint)(iVar4 < (int)uVar53) * iVar4 | (iVar4 >= (int)uVar53) * uVar53;
  *(uint *)((long)out[0xe] + 0xc) =
       (uint)(iVar4 < (int)uVar55) * iVar4 | (iVar4 >= (int)uVar55) * uVar55;
  iVar46 = iVar12 + uVar65;
  iVar10 = iVar6 + uVar74;
  iVar13 = iVar34 + uVar76;
  iVar2 = iVar37 + uVar78;
  iVar12 = uVar65 - iVar12;
  iVar6 = uVar74 - iVar6;
  iVar34 = uVar76 - iVar34;
  iVar37 = uVar78 - iVar37;
  uVar65 = (uint)(iVar46 < iVar9) * iVar9 | (uint)(iVar46 >= iVar9) * iVar46;
  uVar74 = (uint)(iVar10 < iVar9) * iVar9 | (uint)(iVar10 >= iVar9) * iVar10;
  uVar76 = (uint)(iVar13 < iVar9) * iVar9 | (uint)(iVar13 >= iVar9) * iVar13;
  uVar78 = (uint)(iVar2 < iVar9) * iVar9 | (uint)(iVar2 >= iVar9) * iVar2;
  *(uint *)out[2] = (uint)(iVar4 < (int)uVar65) * iVar4 | (iVar4 >= (int)uVar65) * uVar65;
  *(uint *)((long)out[2] + 4) =
       (uint)(iVar4 < (int)uVar74) * iVar4 | (iVar4 >= (int)uVar74) * uVar74;
  *(uint *)(out[2] + 1) = (uint)(iVar4 < (int)uVar76) * iVar4 | (iVar4 >= (int)uVar76) * uVar76;
  *(uint *)((long)out[2] + 0xc) =
       (uint)(iVar4 < (int)uVar78) * iVar4 | (iVar4 >= (int)uVar78) * uVar78;
  uVar65 = (uint)(iVar90 < iVar9) * iVar9 | (uint)(iVar90 >= iVar9) * iVar90;
  uVar74 = (uint)(iVar95 < iVar9) * iVar9 | (uint)(iVar95 >= iVar9) * iVar95;
  uVar76 = (uint)(iVar96 < iVar9) * iVar9 | (uint)(iVar96 >= iVar9) * iVar96;
  uVar78 = (uint)(iVar97 < iVar9) * iVar9 | (uint)(iVar97 >= iVar9) * iVar97;
  uVar47 = (uint)(iVar4 < (int)uVar65) * iVar4 | (iVar4 >= (int)uVar65) * uVar65;
  uVar51 = (uint)(iVar4 < (int)uVar74) * iVar4 | (iVar4 >= (int)uVar74) * uVar74;
  uVar53 = (uint)(iVar4 < (int)uVar76) * iVar4 | (iVar4 >= (int)uVar76) * uVar76;
  uVar55 = (uint)(iVar4 < (int)uVar78) * iVar4 | (iVar4 >= (int)uVar78) * uVar78;
  uVar65 = (uint)(iVar12 < iVar9) * iVar9 | (uint)(iVar12 >= iVar9) * iVar12;
  uVar74 = (uint)(iVar6 < iVar9) * iVar9 | (uint)(iVar6 >= iVar9) * iVar6;
  uVar76 = (uint)(iVar34 < iVar9) * iVar9 | (uint)(iVar34 >= iVar9) * iVar34;
  uVar78 = (uint)(iVar37 < iVar9) * iVar9 | (uint)(iVar37 >= iVar9) * iVar37;
  *(uint *)out[0xd] = (uint)(iVar4 < (int)uVar65) * iVar4 | (iVar4 >= (int)uVar65) * uVar65;
  *(uint *)((long)out[0xd] + 4) =
       (uint)(iVar4 < (int)uVar74) * iVar4 | (iVar4 >= (int)uVar74) * uVar74;
  *(uint *)(out[0xd] + 1) = (uint)(iVar4 < (int)uVar76) * iVar4 | (iVar4 >= (int)uVar76) * uVar76;
  *(uint *)((long)out[0xd] + 0xc) =
       (uint)(iVar4 < (int)uVar78) * iVar4 | (iVar4 >= (int)uVar78) * uVar78;
  iVar46 = iVar50 + uVar47;
  iVar10 = iVar21 + uVar51;
  iVar12 = iVar52 + uVar53;
  iVar13 = iVar54 + uVar55;
  iVar50 = uVar47 - iVar50;
  iVar21 = uVar51 - iVar21;
  iVar52 = uVar53 - iVar52;
  iVar54 = uVar55 - iVar54;
  uVar65 = (uint)(iVar46 < iVar9) * iVar9 | (uint)(iVar46 >= iVar9) * iVar46;
  uVar74 = (uint)(iVar10 < iVar9) * iVar9 | (uint)(iVar10 >= iVar9) * iVar10;
  uVar76 = (uint)(iVar12 < iVar9) * iVar9 | (uint)(iVar12 >= iVar9) * iVar12;
  uVar78 = (uint)(iVar13 < iVar9) * iVar9 | (uint)(iVar13 >= iVar9) * iVar13;
  *(uint *)out[3] = (uint)(iVar4 < (int)uVar65) * iVar4 | (iVar4 >= (int)uVar65) * uVar65;
  *(uint *)((long)out[3] + 4) =
       (uint)(iVar4 < (int)uVar74) * iVar4 | (iVar4 >= (int)uVar74) * uVar74;
  *(uint *)(out[3] + 1) = (uint)(iVar4 < (int)uVar76) * iVar4 | (iVar4 >= (int)uVar76) * uVar76;
  *(uint *)((long)out[3] + 0xc) =
       (uint)(iVar4 < (int)uVar78) * iVar4 | (iVar4 >= (int)uVar78) * uVar78;
  uVar65 = (uint)(iVar108 < iVar9) * iVar9 | (uint)(iVar108 >= iVar9) * iVar108;
  uVar74 = (uint)(iVar110 < iVar9) * iVar9 | (uint)(iVar110 >= iVar9) * iVar110;
  uVar76 = (uint)(iVar109 < iVar9) * iVar9 | (uint)(iVar109 >= iVar9) * iVar109;
  uVar78 = (uint)(iVar111 < iVar9) * iVar9 | (uint)(iVar111 >= iVar9) * iVar111;
  uVar47 = (uint)(iVar4 < (int)uVar65) * iVar4 | (iVar4 >= (int)uVar65) * uVar65;
  uVar51 = (uint)(iVar4 < (int)uVar74) * iVar4 | (iVar4 >= (int)uVar74) * uVar74;
  uVar53 = (uint)(iVar4 < (int)uVar76) * iVar4 | (iVar4 >= (int)uVar76) * uVar76;
  uVar55 = (uint)(iVar4 < (int)uVar78) * iVar4 | (iVar4 >= (int)uVar78) * uVar78;
  uVar65 = (uint)(iVar50 < iVar9) * iVar9 | (uint)(iVar50 >= iVar9) * iVar50;
  uVar74 = (uint)(iVar21 < iVar9) * iVar9 | (uint)(iVar21 >= iVar9) * iVar21;
  uVar76 = (uint)(iVar52 < iVar9) * iVar9 | (uint)(iVar52 >= iVar9) * iVar52;
  uVar78 = (uint)(iVar54 < iVar9) * iVar9 | (uint)(iVar54 >= iVar9) * iVar54;
  *(uint *)out[0xc] = (uint)(iVar4 < (int)uVar65) * iVar4 | (iVar4 >= (int)uVar65) * uVar65;
  *(uint *)((long)out[0xc] + 4) =
       (uint)(iVar4 < (int)uVar74) * iVar4 | (iVar4 >= (int)uVar74) * uVar74;
  *(uint *)(out[0xc] + 1) = (uint)(iVar4 < (int)uVar76) * iVar4 | (iVar4 >= (int)uVar76) * uVar76;
  *(uint *)((long)out[0xc] + 0xc) =
       (uint)(iVar4 < (int)uVar78) * iVar4 | (iVar4 >= (int)uVar78) * uVar78;
  iVar46 = iVar26 + uVar47;
  iVar10 = iVar27 + uVar51;
  iVar12 = iVar28 + uVar53;
  iVar13 = iVar29 + uVar55;
  iVar26 = uVar47 - iVar26;
  iVar27 = uVar51 - iVar27;
  iVar28 = uVar53 - iVar28;
  iVar29 = uVar55 - iVar29;
  uVar65 = (uint)(iVar46 < iVar9) * iVar9 | (uint)(iVar46 >= iVar9) * iVar46;
  uVar74 = (uint)(iVar10 < iVar9) * iVar9 | (uint)(iVar10 >= iVar9) * iVar10;
  uVar76 = (uint)(iVar12 < iVar9) * iVar9 | (uint)(iVar12 >= iVar9) * iVar12;
  uVar78 = (uint)(iVar13 < iVar9) * iVar9 | (uint)(iVar13 >= iVar9) * iVar13;
  *(uint *)out[4] = (uint)(iVar4 < (int)uVar65) * iVar4 | (iVar4 >= (int)uVar65) * uVar65;
  *(uint *)((long)out[4] + 4) =
       (uint)(iVar4 < (int)uVar74) * iVar4 | (iVar4 >= (int)uVar74) * uVar74;
  *(uint *)(out[4] + 1) = (uint)(iVar4 < (int)uVar76) * iVar4 | (iVar4 >= (int)uVar76) * uVar76;
  *(uint *)((long)out[4] + 0xc) =
       (uint)(iVar4 < (int)uVar78) * iVar4 | (iVar4 >= (int)uVar78) * uVar78;
  uVar65 = (uint)(iVar79 < iVar9) * iVar9 | (uint)(iVar79 >= iVar9) * iVar79;
  uVar74 = (uint)(iVar84 < iVar9) * iVar9 | (uint)(iVar84 >= iVar9) * iVar84;
  uVar76 = (uint)(iVar86 < iVar9) * iVar9 | (uint)(iVar86 >= iVar9) * iVar86;
  uVar78 = (uint)(iVar88 < iVar9) * iVar9 | (uint)(iVar88 >= iVar9) * iVar88;
  uVar65 = (uint)(iVar4 < (int)uVar65) * iVar4 | (iVar4 >= (int)uVar65) * uVar65;
  uVar74 = (uint)(iVar4 < (int)uVar74) * iVar4 | (iVar4 >= (int)uVar74) * uVar74;
  uVar76 = (uint)(iVar4 < (int)uVar76) * iVar4 | (iVar4 >= (int)uVar76) * uVar76;
  uVar78 = (uint)(iVar4 < (int)uVar78) * iVar4 | (iVar4 >= (int)uVar78) * uVar78;
  uVar47 = (uint)(iVar26 < iVar9) * iVar9 | (uint)(iVar26 >= iVar9) * iVar26;
  uVar51 = (uint)(iVar27 < iVar9) * iVar9 | (uint)(iVar27 >= iVar9) * iVar27;
  uVar53 = (uint)(iVar28 < iVar9) * iVar9 | (uint)(iVar28 >= iVar9) * iVar28;
  uVar55 = (uint)(iVar29 < iVar9) * iVar9 | (uint)(iVar29 >= iVar9) * iVar29;
  *(uint *)out[0xb] = (uint)(iVar4 < (int)uVar47) * iVar4 | (iVar4 >= (int)uVar47) * uVar47;
  *(uint *)((long)out[0xb] + 4) =
       (uint)(iVar4 < (int)uVar51) * iVar4 | (iVar4 >= (int)uVar51) * uVar51;
  *(uint *)(out[0xb] + 1) = (uint)(iVar4 < (int)uVar53) * iVar4 | (iVar4 >= (int)uVar53) * uVar53;
  *(uint *)((long)out[0xb] + 0xc) =
       (uint)(iVar4 < (int)uVar55) * iVar4 | (iVar4 >= (int)uVar55) * uVar55;
  iVar46 = uVar65 + iVar30;
  iVar10 = uVar74 + iVar57;
  iVar12 = uVar76 + iVar62;
  iVar13 = uVar78 + iVar64;
  iVar30 = uVar65 - iVar30;
  iVar57 = uVar74 - iVar57;
  iVar62 = uVar76 - iVar62;
  iVar64 = uVar78 - iVar64;
  uVar65 = (uint)(iVar46 < iVar9) * iVar9 | (uint)(iVar46 >= iVar9) * iVar46;
  uVar74 = (uint)(iVar10 < iVar9) * iVar9 | (uint)(iVar10 >= iVar9) * iVar10;
  uVar76 = (uint)(iVar12 < iVar9) * iVar9 | (uint)(iVar12 >= iVar9) * iVar12;
  uVar78 = (uint)(iVar13 < iVar9) * iVar9 | (uint)(iVar13 >= iVar9) * iVar13;
  *(uint *)out[5] = (uint)(iVar4 < (int)uVar65) * iVar4 | (iVar4 >= (int)uVar65) * uVar65;
  *(uint *)((long)out[5] + 4) =
       (uint)(iVar4 < (int)uVar74) * iVar4 | (iVar4 >= (int)uVar74) * uVar74;
  *(uint *)(out[5] + 1) = (uint)(iVar4 < (int)uVar76) * iVar4 | (iVar4 >= (int)uVar76) * uVar76;
  *(uint *)((long)out[5] + 0xc) =
       (uint)(iVar4 < (int)uVar78) * iVar4 | (iVar4 >= (int)uVar78) * uVar78;
  uVar65 = (uint)(iVar31 < iVar9) * iVar9 | (uint)(iVar31 >= iVar9) * iVar31;
  uVar74 = (uint)(iVar61 < iVar9) * iVar9 | (uint)(iVar61 >= iVar9) * iVar61;
  uVar76 = (uint)(iVar63 < iVar9) * iVar9 | (uint)(iVar63 >= iVar9) * iVar63;
  uVar78 = (uint)(iVar73 < iVar9) * iVar9 | (uint)(iVar73 >= iVar9) * iVar73;
  uVar65 = (uint)(iVar4 < (int)uVar65) * iVar4 | (iVar4 >= (int)uVar65) * uVar65;
  uVar74 = (uint)(iVar4 < (int)uVar74) * iVar4 | (iVar4 >= (int)uVar74) * uVar74;
  uVar76 = (uint)(iVar4 < (int)uVar76) * iVar4 | (iVar4 >= (int)uVar76) * uVar76;
  uVar78 = (uint)(iVar4 < (int)uVar78) * iVar4 | (iVar4 >= (int)uVar78) * uVar78;
  uVar47 = (uint)(iVar98 < iVar9) * iVar9 | (uint)(iVar98 >= iVar9) * iVar98;
  uVar51 = (uint)(iVar102 < iVar9) * iVar9 | (uint)(iVar102 >= iVar9) * iVar102;
  uVar53 = (uint)(iVar104 < iVar9) * iVar9 | (uint)(iVar104 >= iVar9) * iVar104;
  uVar55 = (uint)(iVar106 < iVar9) * iVar9 | (uint)(iVar106 >= iVar9) * iVar106;
  uVar80 = (uint)(iVar4 < (int)uVar47) * iVar4 | (iVar4 >= (int)uVar47) * uVar47;
  uVar85 = (uint)(iVar4 < (int)uVar51) * iVar4 | (iVar4 >= (int)uVar51) * uVar51;
  uVar87 = (uint)(iVar4 < (int)uVar53) * iVar4 | (iVar4 >= (int)uVar53) * uVar53;
  uVar89 = (uint)(iVar4 < (int)uVar55) * iVar4 | (iVar4 >= (int)uVar55) * uVar55;
  uVar47 = (uint)(iVar30 < iVar9) * iVar9 | (uint)(iVar30 >= iVar9) * iVar30;
  uVar51 = (uint)(iVar57 < iVar9) * iVar9 | (uint)(iVar57 >= iVar9) * iVar57;
  uVar53 = (uint)(iVar62 < iVar9) * iVar9 | (uint)(iVar62 >= iVar9) * iVar62;
  uVar55 = (uint)(iVar64 < iVar9) * iVar9 | (uint)(iVar64 >= iVar9) * iVar64;
  *(uint *)out[10] = (uint)(iVar4 < (int)uVar47) * iVar4 | (iVar4 >= (int)uVar47) * uVar47;
  *(uint *)((long)out[10] + 4) =
       (uint)(iVar4 < (int)uVar51) * iVar4 | (iVar4 >= (int)uVar51) * uVar51;
  *(uint *)(out[10] + 1) = (uint)(iVar4 < (int)uVar53) * iVar4 | (iVar4 >= (int)uVar53) * uVar53;
  *(uint *)((long)out[10] + 0xc) =
       (uint)(iVar4 < (int)uVar55) * iVar4 | (iVar4 >= (int)uVar55) * uVar55;
  iVar46 = uVar80 + uVar65;
  iVar10 = uVar85 + uVar74;
  iVar12 = uVar87 + uVar76;
  iVar13 = uVar89 + uVar78;
  iVar2 = uVar80 - uVar65;
  iVar6 = uVar85 - uVar74;
  iVar7 = uVar87 - uVar76;
  iVar8 = uVar89 - uVar78;
  uVar65 = (uint)(iVar46 < iVar9) * iVar9 | (uint)(iVar46 >= iVar9) * iVar46;
  uVar74 = (uint)(iVar10 < iVar9) * iVar9 | (uint)(iVar10 >= iVar9) * iVar10;
  uVar76 = (uint)(iVar12 < iVar9) * iVar9 | (uint)(iVar12 >= iVar9) * iVar12;
  uVar78 = (uint)(iVar13 < iVar9) * iVar9 | (uint)(iVar13 >= iVar9) * iVar13;
  *(uint *)out[6] = (uint)(iVar4 < (int)uVar65) * iVar4 | (iVar4 >= (int)uVar65) * uVar65;
  *(uint *)((long)out[6] + 4) =
       (uint)(iVar4 < (int)uVar74) * iVar4 | (iVar4 >= (int)uVar74) * uVar74;
  *(uint *)(out[6] + 1) = (uint)(iVar4 < (int)uVar76) * iVar4 | (iVar4 >= (int)uVar76) * uVar76;
  *(uint *)((long)out[6] + 0xc) =
       (uint)(iVar4 < (int)uVar78) * iVar4 | (iVar4 >= (int)uVar78) * uVar78;
  uVar65 = (uint)(iVar99 < iVar9) * iVar9 | (uint)(iVar99 >= iVar9) * iVar99;
  uVar74 = (uint)(iVar103 < iVar9) * iVar9 | (uint)(iVar103 >= iVar9) * iVar103;
  uVar76 = (uint)(iVar105 < iVar9) * iVar9 | (uint)(iVar105 >= iVar9) * iVar105;
  uVar78 = (uint)(iVar107 < iVar9) * iVar9 | (uint)(iVar107 >= iVar9) * iVar107;
  uVar47 = (uint)(iVar4 < (int)uVar65) * iVar4 | (iVar4 >= (int)uVar65) * uVar65;
  uVar51 = (uint)(iVar4 < (int)uVar74) * iVar4 | (iVar4 >= (int)uVar74) * uVar74;
  uVar53 = (uint)(iVar4 < (int)uVar76) * iVar4 | (iVar4 >= (int)uVar76) * uVar76;
  uVar55 = (uint)(iVar4 < (int)uVar78) * iVar4 | (iVar4 >= (int)uVar78) * uVar78;
  uVar65 = (uint)(iVar17 < iVar9) * iVar9 | (uint)(iVar17 >= iVar9) * iVar17;
  uVar74 = (uint)(iVar18 < iVar9) * iVar9 | (uint)(iVar18 >= iVar9) * iVar18;
  uVar76 = (uint)(iVar19 < iVar9) * iVar9 | (uint)(iVar19 >= iVar9) * iVar19;
  uVar78 = (uint)(iVar45 < iVar9) * iVar9 | (uint)(iVar45 >= iVar9) * iVar45;
  uVar65 = (uint)(iVar4 < (int)uVar65) * iVar4 | (iVar4 >= (int)uVar65) * uVar65;
  uVar74 = (uint)(iVar4 < (int)uVar74) * iVar4 | (iVar4 >= (int)uVar74) * uVar74;
  uVar76 = (uint)(iVar4 < (int)uVar76) * iVar4 | (iVar4 >= (int)uVar76) * uVar76;
  uVar78 = (uint)(iVar4 < (int)uVar78) * iVar4 | (iVar4 >= (int)uVar78) * uVar78;
  uVar80 = (uint)(iVar2 < iVar9) * iVar9 | (uint)(iVar2 >= iVar9) * iVar2;
  uVar85 = (uint)(iVar6 < iVar9) * iVar9 | (uint)(iVar6 >= iVar9) * iVar6;
  uVar87 = (uint)(iVar7 < iVar9) * iVar9 | (uint)(iVar7 >= iVar9) * iVar7;
  uVar89 = (uint)(iVar8 < iVar9) * iVar9 | (uint)(iVar8 >= iVar9) * iVar8;
  *(uint *)out[9] = (uint)(iVar4 < (int)uVar80) * iVar4 | (iVar4 >= (int)uVar80) * uVar80;
  *(uint *)((long)out[9] + 4) =
       (uint)(iVar4 < (int)uVar85) * iVar4 | (iVar4 >= (int)uVar85) * uVar85;
  *(uint *)(out[9] + 1) = (uint)(iVar4 < (int)uVar87) * iVar4 | (iVar4 >= (int)uVar87) * uVar87;
  *(uint *)((long)out[9] + 0xc) =
       (uint)(iVar4 < (int)uVar89) * iVar4 | (iVar4 >= (int)uVar89) * uVar89;
  iVar46 = uVar65 + uVar47;
  iVar10 = uVar74 + uVar51;
  iVar12 = uVar76 + uVar53;
  iVar13 = uVar78 + uVar55;
  iVar2 = uVar65 - uVar47;
  iVar6 = uVar74 - uVar51;
  iVar7 = uVar76 - uVar53;
  iVar8 = uVar78 - uVar55;
  uVar65 = (uint)(iVar46 < iVar9) * iVar9 | (uint)(iVar46 >= iVar9) * iVar46;
  uVar74 = (uint)(iVar10 < iVar9) * iVar9 | (uint)(iVar10 >= iVar9) * iVar10;
  uVar76 = (uint)(iVar12 < iVar9) * iVar9 | (uint)(iVar12 >= iVar9) * iVar12;
  uVar78 = (uint)(iVar13 < iVar9) * iVar9 | (uint)(iVar13 >= iVar9) * iVar13;
  uVar47 = (uint)(iVar2 < iVar9) * iVar9 | (uint)(iVar2 >= iVar9) * iVar2;
  uVar51 = (uint)(iVar6 < iVar9) * iVar9 | (uint)(iVar6 >= iVar9) * iVar6;
  uVar53 = (uint)(iVar7 < iVar9) * iVar9 | (uint)(iVar7 >= iVar9) * iVar7;
  uVar55 = (uint)(iVar8 < iVar9) * iVar9 | (uint)(iVar8 >= iVar9) * iVar8;
  *(uint *)out[7] = (uint)(iVar4 < (int)uVar65) * iVar4 | (iVar4 >= (int)uVar65) * uVar65;
  *(uint *)((long)out[7] + 4) =
       (uint)(iVar4 < (int)uVar74) * iVar4 | (iVar4 >= (int)uVar74) * uVar74;
  *(uint *)(out[7] + 1) = (uint)(iVar4 < (int)uVar76) * iVar4 | (iVar4 >= (int)uVar76) * uVar76;
  *(uint *)((long)out[7] + 0xc) =
       (uint)(iVar4 < (int)uVar78) * iVar4 | (iVar4 >= (int)uVar78) * uVar78;
  *(uint *)out[8] = (uint)(iVar4 < (int)uVar47) * iVar4 | (iVar4 >= (int)uVar47) * uVar47;
  *(uint *)((long)out[8] + 4) =
       (uint)(iVar4 < (int)uVar51) * iVar4 | (iVar4 >= (int)uVar51) * uVar51;
  *(uint *)(out[8] + 1) = (uint)(iVar4 < (int)uVar53) * iVar4 | (iVar4 >= (int)uVar53) * uVar53;
  *(uint *)((long)out[8] + 0xc) =
       (uint)(iVar4 < (int)uVar55) * iVar4 | (iVar4 >= (int)uVar55) * uVar55;
  if (do_cols == 0) {
    bVar3 = 10;
    if (10 < bd) {
      bVar3 = (byte)bd;
    }
    local_58 = 0x20 << (bVar3 & 0x1f);
    local_48 = -local_58;
    local_58 = local_58 + -1;
    iStack_54 = local_58;
    iStack_50 = local_58;
    iStack_4c = local_58;
    iStack_44 = local_48;
    iStack_40 = local_48;
    iStack_3c = local_48;
    round_shift_8x8(out,out_shift);
    highbd_clamp_epi32_sse4_1(out,out,(__m128i *)&local_48,(__m128i *)&local_58,0x10);
  }
  return;
}

Assistant:

static void idct16x16_low8_sse4_1(__m128i *in, __m128i *out, int bit,
                                  int do_cols, int bd, int out_shift) {
  const int32_t *cospi = cospi_arr(bit);
  const __m128i cospi60 = _mm_set1_epi32(cospi[60]);
  const __m128i cospi28 = _mm_set1_epi32(cospi[28]);
  const __m128i cospi44 = _mm_set1_epi32(cospi[44]);
  const __m128i cospi20 = _mm_set1_epi32(cospi[20]);
  const __m128i cospi12 = _mm_set1_epi32(cospi[12]);
  const __m128i cospi4 = _mm_set1_epi32(cospi[4]);
  const __m128i cospi56 = _mm_set1_epi32(cospi[56]);
  const __m128i cospi24 = _mm_set1_epi32(cospi[24]);
  const __m128i cospim40 = _mm_set1_epi32(-cospi[40]);
  const __m128i cospi8 = _mm_set1_epi32(cospi[8]);
  const __m128i cospi32 = _mm_set1_epi32(cospi[32]);
  const __m128i cospi48 = _mm_set1_epi32(cospi[48]);
  const __m128i cospi16 = _mm_set1_epi32(cospi[16]);
  const __m128i cospim16 = _mm_set1_epi32(-cospi[16]);
  const __m128i cospim48 = _mm_set1_epi32(-cospi[48]);
  const __m128i cospim36 = _mm_set1_epi32(-cospi[36]);
  const __m128i cospim52 = _mm_set1_epi32(-cospi[52]);
  const __m128i rnding = _mm_set1_epi32(1 << (bit - 1));
  const int log_range = AOMMAX(16, bd + (do_cols ? 6 : 8));
  const __m128i clamp_lo = _mm_set1_epi32(-(1 << (log_range - 1)));
  const __m128i clamp_hi = _mm_set1_epi32((1 << (log_range - 1)) - 1);
  __m128i u[16], x, y;
  // stage 0
  // stage 1
  u[0] = in[0];
  u[2] = in[4];
  u[4] = in[2];
  u[6] = in[6];
  u[8] = in[1];
  u[10] = in[5];
  u[12] = in[3];
  u[14] = in[7];

  // stage 2
  u[15] = half_btf_0_sse4_1(&cospi4, &u[8], &rnding, bit);
  u[8] = half_btf_0_sse4_1(&cospi60, &u[8], &rnding, bit);

  u[9] = half_btf_0_sse4_1(&cospim36, &u[14], &rnding, bit);
  u[14] = half_btf_0_sse4_1(&cospi28, &u[14], &rnding, bit);

  u[13] = half_btf_0_sse4_1(&cospi20, &u[10], &rnding, bit);
  u[10] = half_btf_0_sse4_1(&cospi44, &u[10], &rnding, bit);

  u[11] = half_btf_0_sse4_1(&cospim52, &u[12], &rnding, bit);
  u[12] = half_btf_0_sse4_1(&cospi12, &u[12], &rnding, bit);

  // stage 3
  u[7] = half_btf_0_sse4_1(&cospi8, &u[4], &rnding, bit);
  u[4] = half_btf_0_sse4_1(&cospi56, &u[4], &rnding, bit);
  u[5] = half_btf_0_sse4_1(&cospim40, &u[6], &rnding, bit);
  u[6] = half_btf_0_sse4_1(&cospi24, &u[6], &rnding, bit);

  addsub_sse4_1(u[8], u[9], &u[8], &u[9], &clamp_lo, &clamp_hi);
  addsub_sse4_1(u[11], u[10], &u[11], &u[10], &clamp_lo, &clamp_hi);
  addsub_sse4_1(u[12], u[13], &u[12], &u[13], &clamp_lo, &clamp_hi);
  addsub_sse4_1(u[15], u[14], &u[15], &u[14], &clamp_lo, &clamp_hi);

  // stage 4
  x = _mm_mullo_epi32(u[0], cospi32);
  u[0] = _mm_add_epi32(x, rnding);
  u[0] = _mm_srai_epi32(u[0], bit);
  u[1] = u[0];

  u[3] = half_btf_0_sse4_1(&cospi16, &u[2], &rnding, bit);
  u[2] = half_btf_0_sse4_1(&cospi48, &u[2], &rnding, bit);

  addsub_sse4_1(u[4], u[5], &u[4], &u[5], &clamp_lo, &clamp_hi);
  addsub_sse4_1(u[7], u[6], &u[7], &u[6], &clamp_lo, &clamp_hi);

  x = half_btf_sse4_1(&cospim16, &u[9], &cospi48, &u[14], &rnding, bit);
  u[14] = half_btf_sse4_1(&cospi48, &u[9], &cospi16, &u[14], &rnding, bit);
  u[9] = x;
  y = half_btf_sse4_1(&cospim48, &u[10], &cospim16, &u[13], &rnding, bit);
  u[13] = half_btf_sse4_1(&cospim16, &u[10], &cospi48, &u[13], &rnding, bit);
  u[10] = y;

  // stage 5
  addsub_sse4_1(u[0], u[3], &u[0], &u[3], &clamp_lo, &clamp_hi);
  addsub_sse4_1(u[1], u[2], &u[1], &u[2], &clamp_lo, &clamp_hi);

  x = _mm_mullo_epi32(u[5], cospi32);
  y = _mm_mullo_epi32(u[6], cospi32);
  u[5] = _mm_sub_epi32(y, x);
  u[5] = _mm_add_epi32(u[5], rnding);
  u[5] = _mm_srai_epi32(u[5], bit);

  u[6] = _mm_add_epi32(y, x);
  u[6] = _mm_add_epi32(u[6], rnding);
  u[6] = _mm_srai_epi32(u[6], bit);

  addsub_sse4_1(u[8], u[11], &u[8], &u[11], &clamp_lo, &clamp_hi);
  addsub_sse4_1(u[9], u[10], &u[9], &u[10], &clamp_lo, &clamp_hi);
  addsub_sse4_1(u[15], u[12], &u[15], &u[12], &clamp_lo, &clamp_hi);
  addsub_sse4_1(u[14], u[13], &u[14], &u[13], &clamp_lo, &clamp_hi);

  // stage 6
  addsub_sse4_1(u[0], u[7], &u[0], &u[7], &clamp_lo, &clamp_hi);
  addsub_sse4_1(u[1], u[6], &u[1], &u[6], &clamp_lo, &clamp_hi);
  addsub_sse4_1(u[2], u[5], &u[2], &u[5], &clamp_lo, &clamp_hi);
  addsub_sse4_1(u[3], u[4], &u[3], &u[4], &clamp_lo, &clamp_hi);

  x = _mm_mullo_epi32(u[10], cospi32);
  y = _mm_mullo_epi32(u[13], cospi32);
  u[10] = _mm_sub_epi32(y, x);
  u[10] = _mm_add_epi32(u[10], rnding);
  u[10] = _mm_srai_epi32(u[10], bit);

  u[13] = _mm_add_epi32(x, y);
  u[13] = _mm_add_epi32(u[13], rnding);
  u[13] = _mm_srai_epi32(u[13], bit);

  x = _mm_mullo_epi32(u[11], cospi32);
  y = _mm_mullo_epi32(u[12], cospi32);
  u[11] = _mm_sub_epi32(y, x);
  u[11] = _mm_add_epi32(u[11], rnding);
  u[11] = _mm_srai_epi32(u[11], bit);

  u[12] = _mm_add_epi32(x, y);
  u[12] = _mm_add_epi32(u[12], rnding);
  u[12] = _mm_srai_epi32(u[12], bit);
  // stage 7
  addsub_sse4_1(u[0], u[15], out + 0, out + 15, &clamp_lo, &clamp_hi);
  addsub_sse4_1(u[1], u[14], out + 1, out + 14, &clamp_lo, &clamp_hi);
  addsub_sse4_1(u[2], u[13], out + 2, out + 13, &clamp_lo, &clamp_hi);
  addsub_sse4_1(u[3], u[12], out + 3, out + 12, &clamp_lo, &clamp_hi);
  addsub_sse4_1(u[4], u[11], out + 4, out + 11, &clamp_lo, &clamp_hi);
  addsub_sse4_1(u[5], u[10], out + 5, out + 10, &clamp_lo, &clamp_hi);
  addsub_sse4_1(u[6], u[9], out + 6, out + 9, &clamp_lo, &clamp_hi);
  addsub_sse4_1(u[7], u[8], out + 7, out + 8, &clamp_lo, &clamp_hi);

  if (!do_cols) {
    const int log_range_out = AOMMAX(16, bd + 6);
    const __m128i clamp_lo_out = _mm_set1_epi32(-(1 << (log_range_out - 1)));
    const __m128i clamp_hi_out = _mm_set1_epi32((1 << (log_range_out - 1)) - 1);
    round_shift_8x8(out, out_shift);
    highbd_clamp_epi32_sse4_1(out, out, &clamp_lo_out, &clamp_hi_out, 16);
  }
}